

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::SerializerTest_shouldSerializeLocaleIndependent_Test::TestBody
          (SerializerTest_shouldSerializeLocaleIndependent_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  this_00;
  char *message;
  unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_> localeWithCommaDecimalSeparator;
  AssertionResult gtest_ar;
  string serialized;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  long local_a0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [16];
  char local_88 [8];
  undefined8 *local_80;
  AssertHelper local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  detail::make_unique<RAIILocale,char_const(&)[12]>
            ((detail *)&local_a8,(char (*) [12])"de_DE.UTF-8");
  this_00._M_head_impl = local_a8._M_head_impl;
  local_a8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  Serializer::Serialize_abi_cxx11_
            (&local_58,&(this->super_SerializerTest).textSerializer.super_Serializer,
             &(this->super_SerializerTest).collected);
  testing::HasSubstr<char[4]>(&local_38,(StringLike<char[4]> *)0x1837a2);
  local_a8._M_head_impl = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_38.impl_.substring_._M_dataplus._M_p,
             local_38.impl_.substring_._M_dataplus._M_p + local_38.impl_.substring_._M_string_length
            );
  local_78[0].data_ = (AssertHelperData *)local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,local_a8._M_head_impl,local_a8._M_head_impl + local_a0);
  if (local_a8._M_head_impl != local_98) {
    operator_delete(local_a8._M_head_impl);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_88,(char *)local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  if (local_78[0].data_ != (AssertHelperData *)local_68) {
    operator_delete(local_78[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.impl_.substring_._M_dataplus._M_p != &local_38.impl_.substring_.field_2) {
    operator_delete(local_38.impl_.substring_._M_dataplus._M_p);
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if (local_80 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if (local_a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    }
  }
  if (local_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (this_00._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    RAIILocale::~RAIILocale((RAIILocale *)this_00._M_head_impl);
    operator_delete(this_00._M_head_impl);
  }
  return;
}

Assistant:

TEST_F(SerializerTest, shouldSerializeLocaleIndependent) {
  std::unique_ptr<RAIILocale> localeWithCommaDecimalSeparator;

  // ignore missing locale and skip test if setup fails
  try {
    localeWithCommaDecimalSeparator =
        detail::make_unique<RAIILocale>("de_DE.UTF-8");
  } catch (std::runtime_error&) {
    GTEST_SKIP();
  }

  const auto serialized = textSerializer.Serialize(collected);
  EXPECT_THAT(serialized, testing::HasSubstr(" 1\n"));
}